

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int *piVar3;
  Layer *pLVar4;
  undefined4 *puVar5;
  void *pvVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined3 uVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint _w;
  int iVar24;
  byte bVar25;
  uint uVar26;
  Option *pOVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  size_t _elemsize;
  void *pvVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar77;
  float fVar78;
  undefined1 auVar73 [16];
  float fVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_218;
  undefined4 local_208;
  Mat local_1f8;
  Mat local_1a8;
  Mat local_158;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  pointer local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined4 local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if ((opt->use_int8_inference == true) && ((this->super_ConvolutionDepthWise).int8_scale_term != 0)
     ) {
    iVar15 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar15;
  }
  uVar20 = bottom_blob->c;
  uVar30 = bottom_blob->elemsize;
  iVar15 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar31 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar19 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar2 = (this->super_ConvolutionDepthWise).dilation_h;
  iVar24 = bottom_blob->elempack;
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,bottom_blob,&local_1a8,opt);
  iVar13 = local_1a8.w;
  iVar17 = -100;
  if ((local_1a8.data == (void *)0x0) || ((long)local_1a8.c * local_1a8.cstep == 0))
  goto LAB_003ec363;
  iVar15 = (~((iVar15 + -1) * iVar31) + local_1a8.w) / (this->super_ConvolutionDepthWise).stride_w;
  _w = iVar15 + 1;
  iVar31 = (~((iVar19 + -1) * iVar2) + local_1a8.h) / (this->super_ConvolutionDepthWise).stride_h;
  uVar23 = (this->super_ConvolutionDepthWise).num_output;
  uVar29 = 1;
  if (opt->use_packing_layout == true) {
    uVar29 = 8;
    if ((uVar23 & 7) != 0) {
      uVar29 = (ulong)((uVar23 & 3) == 0) * 3 + 1;
    }
  }
  uVar16 = (uint)uVar29;
  _elemsize = (uVar30 / (ulong)(long)iVar24) * uVar29;
  Mat::create(top_blob,_w,iVar31 + 1,(int)uVar23 / (int)uVar16,_elemsize,uVar16,opt->blob_allocator)
  ;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003ec363;
  iVar19 = (this->super_ConvolutionDepthWise).num_output;
  iVar2 = (this->super_ConvolutionDepthWise).group;
  if (iVar2 != iVar19 || iVar24 * uVar20 != iVar2) {
LAB_003ebb6c:
    uVar30 = (long)(int)(iVar24 * uVar20) / (long)iVar2;
    uVar23 = iVar19 / iVar2;
    iVar15 = 1;
    uVar20 = 1;
    if (opt->use_packing_layout == true) {
      iVar15 = (uint)((uVar30 & 3) == 0) * 3 + 1;
      if ((uVar30 & 7) == 0) {
        iVar15 = 8;
      }
      uVar20 = (uint)((uVar23 & 3) == 0) * 3 + 1;
      if ((uVar23 & 7) == 0) {
        uVar20 = 8;
      }
    }
    piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    local_158.refcount = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
    local_158.data = local_1a8.data;
    local_158.elemsize = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
    local_158.elempack = local_1a8.elempack;
    local_158.allocator = local_1a8.allocator;
    local_158.w = local_1a8.w;
    local_158.dims = local_1a8.dims;
    local_158.d = local_1a8.d;
    local_158.h = local_1a8.h;
    local_158.c = local_1a8.c;
    local_158.cstep = local_1a8.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (iVar15 < iVar24) {
      local_1f8.data = *(void **)opt;
      local_1f8.elemsize = (size_t)opt->workspace_allocator;
      local_1f8.elempack = opt->openmp_blocktime;
      local_1f8._28_1_ = opt->use_winograd_convolution;
      local_1f8._29_1_ = opt->use_sgemm_convolution;
      local_1f8._30_1_ = opt->use_int8_inference;
      local_1f8._31_1_ = opt->use_vulkan_compute;
      local_1f8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1f8._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_1f8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1f8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
      local_1f8.refcount = (int *)opt->workspace_allocator;
      convert_packing(&local_1a8,&local_158,iVar15,(Option *)&local_1f8);
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0))
      goto LAB_003ebcc6;
      iVar17 = -100;
    }
    else {
LAB_003ebcc6:
      piVar3 = top_blob->refcount;
      local_1f8.data = top_blob->data;
      local_1f8.refcount = top_blob->refcount;
      local_1f8.elemsize = top_blob->elemsize;
      local_1f8.elempack = top_blob->elempack;
      local_1f8.allocator = top_blob->allocator;
      local_1f8.dims = top_blob->dims;
      local_1f8.w = top_blob->w;
      local_1f8.h = top_blob->h;
      local_1f8.d = top_blob->d;
      local_1f8.c = top_blob->c;
      local_1f8.cstep = top_blob->cstep;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      if (uVar20 < uVar16) {
        Mat::create(&local_1f8,_w,iVar31 + 1,
                    (this->super_ConvolutionDepthWise).num_output / (int)uVar20,
                    (ulong)uVar20 * (_elemsize / uVar29),uVar20,opt->workspace_allocator);
        iVar17 = -100;
        if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0))
        goto LAB_003ebd93;
      }
      else {
LAB_003ebd93:
        if (0 < (this->super_ConvolutionDepthWise).group) {
          iVar31 = 0;
          iVar19 = 0;
          lVar28 = 0;
          do {
            local_c0 = (pointer)((long)(iVar31 / iVar15) * local_158.cstep * local_158.elemsize +
                                (long)local_158.data);
            local_b8 = (int *)0x0;
            local_b0 = local_158.elemsize;
            local_a8 = local_158.elempack;
            local_a0 = local_158.allocator;
            local_208 = (undefined4)
                        ((long)((ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 | uVar30 & 0xffffffff) /
                        (long)iVar15);
            local_88 = local_208;
            local_80 = ((long)local_158.d * local_158.elemsize *
                        (long)local_158.h * (long)local_158.w + 0xf & 0xfffffffffffffff0) /
                       local_158.elemsize;
            local_98 = local_158.dims;
            iStack_94 = local_158.w;
            iStack_90 = local_158.h;
            iStack_8c = local_158.d;
            local_108 = (void *)((long)(iVar19 / (int)uVar20) * local_1f8.cstep * local_1f8.elemsize
                                + (long)local_1f8.data);
            local_100 = (int *)0x0;
            local_f8 = (Allocator *)local_1f8.elemsize;
            local_f0 = local_1f8.elempack;
            local_e8 = local_1f8.allocator;
            local_c8 = ((long)local_1f8.d * local_1f8.elemsize *
                        (long)local_1f8.h * (long)local_1f8.w + 0xf & 0xfffffffffffffff0) /
                       local_1f8.elemsize;
            local_e0 = local_1f8.dims;
            iStack_dc = local_1f8.w;
            iStack_d8 = local_1f8.h;
            iStack_d4 = local_1f8.d;
            pLVar4 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar28];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            local_58._0_1_ = opt->use_bf16_storage;
            local_58._1_1_ = opt->use_fp16_packed;
            local_58._2_1_ = opt->use_fp16_storage;
            local_58._3_1_ = opt->use_fp16_arithmetic;
            local_58._4_1_ = opt->use_int8_packed;
            local_58._5_1_ = opt->use_int8_storage;
            local_58._6_1_ = opt->use_int8_arithmetic;
            local_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = local_1f8.allocator;
            local_d0 = (int)uVar23 / (int)uVar20;
            iVar17 = (*pLVar4->_vptr_Layer[7])(pLVar4,&local_c0,&local_108,&local_78);
            if (local_100 != (int *)0x0) {
              LOCK();
              *local_100 = *local_100 + -1;
              UNLOCK();
              if (*local_100 == 0) {
                if (local_e8 == (Allocator *)0x0) {
                  if (local_108 != (void *)0x0) {
                    free(local_108);
                  }
                }
                else {
                  (*local_e8->_vptr_Allocator[3])();
                }
              }
            }
            if (local_b8 != (int *)0x0) {
              LOCK();
              *local_b8 = *local_b8 + -1;
              UNLOCK();
              if (*local_b8 == 0) {
                if (local_a0 == (Allocator *)0x0) {
                  if (local_c0 != (pointer)0x0) {
                    free(local_c0);
                  }
                }
                else {
                  (*local_a0->_vptr_Allocator[3])();
                }
              }
            }
            if (iVar17 != 0) goto LAB_003ec2f1;
            lVar28 = lVar28 + 1;
            iVar19 = iVar19 + uVar23;
            iVar31 = iVar31 + (int)uVar30;
          } while (lVar28 < (this->super_ConvolutionDepthWise).group);
        }
        if (uVar20 < uVar16) {
          convert_packing(&local_1f8,top_blob,uVar16,opt);
          iVar17 = -100;
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
          goto LAB_003ec2f1;
        }
        else if (&local_1f8 != top_blob) {
          if ((Allocator *)local_1f8.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_1f8.refcount =
                 *(int *)(_func_int ***)local_1f8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_1f8.data;
          top_blob->refcount = local_1f8.refcount;
          top_blob->elemsize = local_1f8.elemsize;
          top_blob->elempack = local_1f8.elempack;
          top_blob->allocator = local_1f8.allocator;
          top_blob->dims = local_1f8.dims;
          top_blob->w = local_1f8.w;
          top_blob->h = local_1f8.h;
          top_blob->d = local_1f8.d;
          top_blob->c = local_1f8.c;
          top_blob->cstep = local_1f8.cstep;
        }
        iVar17 = 0;
      }
LAB_003ec2f1:
      if ((Allocator *)local_1f8.refcount != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_1f8.refcount = *(int *)(_func_int ***)local_1f8.refcount + -1;
        UNLOCK();
        if (*(int *)(_func_int ***)local_1f8.refcount == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + -1;
      UNLOCK();
      if (*local_158.refcount == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_003ec363;
  }
  if (iVar24 == 1) {
    auVar56._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar56._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar56._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar56._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar56 = vpcmpeqd_avx(auVar56,_DAT_005a3340);
    uVar26 = vmovmskps_avx(auVar56);
    iVar15 = (this->super_ConvolutionDepthWise).stride_w;
    uVar23 = (this->super_ConvolutionDepthWise).stride_h;
    if (uVar23 == 1 && (iVar15 == 1 && (uVar26 ^ 0xf) == 0)) {
      convdw3x3s1_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                      (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                      (Option *)(ulong)uVar23);
    }
    else {
      bVar33 = (char)(uVar26 ^ 0xf) == '\0';
      if ((uVar23 != 2 || iVar15 != 2) || !bVar33) goto LAB_003ebb6c;
      convdw3x3s2_sse(&local_1a8,top_blob,(Mat *)(this->weight_data_tm).data,
                      (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                      (Option *)
                      (ulong)CONCAT31((int3)(uVar23 >> 8),(uVar23 == 2 && iVar15 == 2) && bVar33));
    }
LAB_003ec272:
    pLVar4 = this->activation;
    if (pLVar4 != (Layer *)0x0) {
      (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
    }
  }
  else {
    if (iVar24 != 4) {
      if (iVar24 != 8) goto LAB_003ebb6c;
      auVar64._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
      auVar64._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
      auVar64._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
      auVar64._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
      auVar56 = vpcmpeqd_avx(auVar64,_DAT_005a3340);
      uVar16 = vmovmskps_avx(auVar56);
      uVar23 = (this->super_ConvolutionDepthWise).stride_w;
      uVar26 = uVar23 ^ 1 | uVar16 ^ 0xf;
      iVar19 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar19 == 1 && uVar26 == 0) {
        convdw3x3s1_pack8_avx
                  (&local_1a8,top_blob,&this->weight_data_tm,
                   (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,(Option *)(ulong)uVar26)
        ;
      }
      else {
        bVar14 = (byte)uVar16;
        uVar12 = (undefined3)(uVar26 >> 8);
        if ((iVar19 == 2 && uVar23 == 2) && bVar14 == 0xf) {
          convdw3x3s2_pack8_avx
                    (&local_1a8,top_blob,&this->weight_data_tm,
                     (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                     (Option *)(ulong)CONCAT31(uVar12,(iVar19 == 2 && uVar23 == 2) && bVar14 == 0xf)
                    );
        }
        else {
          bVar14 = bVar14 >> 2 & bVar14 >> 3 & (auVar64._4_4_ == 5 && auVar64._0_4_ == 5);
          bVar25 = (uVar23 == 1 && iVar19 == 1) & bVar14;
          pOVar27 = (Option *)(ulong)CONCAT31(uVar12,bVar25);
          if (bVar25 == 1) {
            convdw5x5s1_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar27);
          }
          else {
            if ((bVar14 & (uVar23 == 2 && iVar19 == 2)) != 1) {
              uVar23 = auVar64._4_4_ * auVar64._0_4_;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar23,
                         (allocator_type *)&local_1f8);
              iVar19 = (this->super_ConvolutionDepthWise).kernel_h;
              if (0 < iVar19) {
                iVar2 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar24 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar17 = (this->super_ConvolutionDepthWise).dilation_w * iVar24;
                iVar18 = 0;
                iVar21 = 0;
                iVar22 = 0;
                do {
                  if (0 < iVar24) {
                    lVar28 = 0;
                    do {
                      *(int *)((long)local_158.data + (iVar18 + lVar28) * 4) = iVar21;
                      iVar21 = iVar21 + (this->super_ConvolutionDepthWise).dilation_w;
                      iVar24 = (this->super_ConvolutionDepthWise).kernel_w;
                      lVar28 = lVar28 + 1;
                    } while ((int)lVar28 < iVar24);
                    iVar18 = iVar18 + (int)lVar28;
                    iVar19 = (this->super_ConvolutionDepthWise).kernel_h;
                  }
                  iVar21 = iVar21 + (iVar13 * iVar2 - iVar17);
                  iVar22 = iVar22 + 1;
                } while (iVar22 < iVar19);
              }
              if (0 < (int)uVar20) {
                iVar19 = 0;
                local_218 = 0;
                do {
                  if (-1 < iVar31) {
                    pvVar32 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize +
                                      (long)top_blob->data);
                    pvVar6 = (this->weight_data_tm).data;
                    iVar2 = 0;
                    do {
                      if (-1 < iVar15) {
                        uVar30 = 0;
                        do {
                          if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                            auVar43 = ZEXT1664((undefined1  [16])0x0);
                          }
                          else {
                            auVar43 = ZEXT3264(*(undefined1 (*) [32])
                                                ((long)(this->super_ConvolutionDepthWise).bias_data.
                                                       data + local_218 * 0x20));
                          }
                          auVar42 = auVar43._0_32_;
                          if (0 < (int)uVar23) {
                            lVar28 = 0;
                            do {
                              auVar56 = vfmadd231ps_fma(auVar43._0_32_,
                                                        *(undefined1 (*) [32])
                                                         ((long)local_1a8.data +
                                                         (long)*(int *)((long)local_158.data +
                                                                       lVar28) * 0x20 +
                                                         (long)((this->super_ConvolutionDepthWise).
                                                                stride_w * (int)uVar30 * 8) * 4 +
                                                         (long)(this->super_ConvolutionDepthWise).
                                                               stride_h * (long)iVar2 *
                                                         (long)local_1a8.w *
                                                         CONCAT44(local_1a8.elemsize._4_4_,
                                                                  (undefined4)local_1a8.elemsize) +
                                                         local_1a8.cstep * local_218 *
                                                         CONCAT44(local_1a8.elemsize._4_4_,
                                                                  (undefined4)local_1a8.elemsize)),
                                                        *(undefined1 (*) [32])
                                                         ((long)pvVar6 +
                                                         lVar28 * 8 + (long)iVar19 * 4));
                              auVar43 = ZEXT1664(auVar56);
                              auVar42 = ZEXT1632(auVar56);
                              lVar28 = lVar28 + 4;
                            } while ((ulong)uVar23 << 2 != lVar28);
                          }
                          *(undefined1 (*) [32])((long)pvVar32 + uVar30 * 0x20) = auVar42;
                          uVar30 = uVar30 + 1;
                        } while (uVar30 != _w);
                      }
                      pvVar32 = (void *)((long)pvVar32 + (long)(int)(_w * 8) * 4);
                      bVar33 = iVar2 != iVar31;
                      iVar2 = iVar2 + 1;
                    } while (bVar33);
                  }
                  local_218 = local_218 + 1;
                  iVar19 = iVar19 + uVar23 * 8;
                } while (local_218 != uVar20);
              }
              pLVar4 = this->activation;
              if (pLVar4 != (Layer *)0x0) {
                (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
              }
              goto LAB_003ecc3a;
            }
            convdw5x5s2_pack8_avx
                      (&local_1a8,top_blob,&this->weight_data_tm,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar27);
          }
        }
      }
      goto LAB_003ec272;
    }
    auVar45._0_4_ = (this->super_ConvolutionDepthWise).kernel_w;
    auVar45._4_4_ = (this->super_ConvolutionDepthWise).kernel_h;
    auVar45._8_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar45._12_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar56 = vpcmpeqd_avx(auVar45,_DAT_005a3340);
    uVar16 = vmovmskps_avx(auVar56);
    uVar23 = (this->super_ConvolutionDepthWise).stride_w;
    uVar26 = uVar23 ^ 1 | uVar16 ^ 0xf;
    iVar19 = (this->super_ConvolutionDepthWise).stride_h;
    if (iVar19 == 1 && uVar26 == 0) {
      convdw3x3s1_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,(Option *)(ulong)uVar26);
      goto LAB_003ec272;
    }
    bVar14 = (byte)uVar16;
    uVar12 = (undefined3)(uVar26 >> 8);
    if ((iVar19 == 2 && uVar23 == 2) && bVar14 == 0xf) {
      convdw3x3s2_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,
                 (Option *)(ulong)CONCAT31(uVar12,(iVar19 == 2 && uVar23 == 2) && bVar14 == 0xf));
      goto LAB_003ec272;
    }
    bVar14 = bVar14 >> 2 & bVar14 >> 3 & (auVar45._4_4_ == 5 && auVar45._0_4_ == 5);
    bVar25 = (uVar23 == 1 && iVar19 == 1) & bVar14;
    pOVar27 = (Option *)(ulong)CONCAT31(uVar12,bVar25);
    if (bVar25 == 1) {
      convdw5x5s1_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar27);
      goto LAB_003ec272;
    }
    if ((bVar14 & (uVar23 == 2 && iVar19 == 2)) == 1) {
      convdw5x5s2_pack4_sse
                (&local_1a8,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,pOVar27);
      goto LAB_003ec272;
    }
    uVar23 = auVar45._4_4_ * auVar45._0_4_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_158,(long)(int)uVar23,
               (allocator_type *)&local_1f8);
    iVar19 = (this->super_ConvolutionDepthWise).kernel_h;
    if (0 < iVar19) {
      iVar2 = (this->super_ConvolutionDepthWise).dilation_h;
      iVar24 = (this->super_ConvolutionDepthWise).kernel_w;
      iVar17 = (this->super_ConvolutionDepthWise).dilation_w * iVar24;
      iVar18 = 0;
      iVar21 = 0;
      iVar22 = 0;
      do {
        if (0 < iVar24) {
          lVar28 = 0;
          do {
            *(int *)((long)local_158.data + (iVar22 + lVar28) * 4) = iVar21;
            iVar21 = iVar21 + (this->super_ConvolutionDepthWise).dilation_w;
            iVar24 = (this->super_ConvolutionDepthWise).kernel_w;
            lVar28 = lVar28 + 1;
          } while ((int)lVar28 < iVar24);
          iVar22 = iVar22 + (int)lVar28;
          iVar19 = (this->super_ConvolutionDepthWise).kernel_h;
        }
        iVar21 = iVar21 + (iVar13 * iVar2 - iVar17);
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar19);
    }
    if (0 < (int)uVar20) {
      iVar19 = 0;
      auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar43 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar68 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      local_218 = 0;
      auVar72._8_4_ = 0x3c088908;
      auVar72._0_8_ = 0x3c0889083c088908;
      auVar72._12_4_ = 0x3c088908;
      do {
        if (-1 < iVar31) {
          pvVar32 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize + (long)top_blob->data
                            );
          pvVar6 = (this->weight_data_tm).data;
          iVar2 = 0;
          do {
            if (-1 < iVar15) {
              uVar30 = 0;
              do {
                if ((this->super_ConvolutionDepthWise).bias_term == 0) {
                  auVar73 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar73 = *(undefined1 (*) [16])
                             ((long)(this->super_ConvolutionDepthWise).bias_data.data +
                             local_218 * 0x10);
                }
                if (0 < (int)uVar23) {
                  lVar28 = 0;
                  do {
                    auVar73 = vfmadd231ps_fma(auVar73,*(undefined1 (*) [16])
                                                       ((long)pvVar6 + lVar28 * 4 + (long)iVar19 * 4
                                                       ),
                                              *(undefined1 (*) [16])
                                               ((long)local_1a8.data +
                                               (long)*(int *)((long)local_158.data + lVar28) * 0x10
                                               + (long)((this->super_ConvolutionDepthWise).stride_w
                                                        * (int)uVar30 * 4) * 4 +
                                                 (long)(this->super_ConvolutionDepthWise).stride_h *
                                                 (long)iVar2 *
                                                 (long)local_1a8.w *
                                                 CONCAT44(local_1a8.elemsize._4_4_,
                                                          (undefined4)local_1a8.elemsize) +
                                                 local_1a8.cstep * local_218 *
                                                 CONCAT44(local_1a8.elemsize._4_4_,
                                                          (undefined4)local_1a8.elemsize)));
                    lVar28 = lVar28 + 4;
                  } while ((ulong)uVar23 << 2 != lVar28);
                }
                auVar45 = auVar92._0_16_;
                auVar64 = auVar68._0_16_;
                auVar56 = auVar43._0_16_;
                fVar8 = auVar68._4_4_;
                fVar9 = auVar68._8_4_;
                fVar10 = auVar68._12_4_;
                fVar77 = auVar73._4_4_;
                fVar7 = auVar68._0_4_;
                fVar78 = auVar73._8_4_;
                fVar79 = auVar73._12_4_;
                switch((this->super_ConvolutionDepthWise).activation_type) {
                case 1:
                  auVar73 = vmaxps_avx(auVar73,auVar45);
                  break;
                case 2:
                  auVar56 = vmaxps_avx(auVar73,auVar45);
                  auVar64 = vminps_avx(auVar73,auVar45);
                  uVar1 = *(this->super_ConvolutionDepthWise).activation_params.data;
                  auVar76._4_4_ = uVar1;
                  auVar76._0_4_ = uVar1;
                  auVar76._8_4_ = uVar1;
                  auVar76._12_4_ = uVar1;
                  auVar73 = vfmadd213ps_fma(auVar76,auVar64,auVar56);
                  break;
                case 3:
                  puVar5 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar5;
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  uVar1 = puVar5[1];
                  auVar102._4_4_ = uVar1;
                  auVar102._0_4_ = uVar1;
                  auVar102._8_4_ = uVar1;
                  auVar102._12_4_ = uVar1;
                  auVar56 = vmaxps_avx(auVar73,auVar47);
                  auVar73 = vminps_avx(auVar102,auVar56);
                  break;
                case 4:
                  auVar48._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
                  auVar48._8_4_ = -fVar78;
                  auVar48._12_4_ = -fVar79;
                  auVar57._8_4_ = 0x42b0c0a5;
                  auVar57._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar57._12_4_ = 0x42b0c0a5;
                  auVar45 = vminps_avx(auVar48,auVar57);
                  auVar58._8_4_ = 0xc2b0c0a5;
                  auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar58._12_4_ = 0xc2b0c0a5;
                  auVar89 = vmaxps_avx(auVar45,auVar58);
                  auVar74._8_4_ = 0x3fb8aa3b;
                  auVar74._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar74._12_4_ = 0x3fb8aa3b;
                  auVar45 = vfmadd213ps_fma(auVar74,auVar89,auVar56);
                  auVar103._0_4_ = (int)auVar45._0_4_;
                  auVar103._4_4_ = (int)auVar45._4_4_;
                  auVar103._8_4_ = (int)auVar45._8_4_;
                  auVar103._12_4_ = (int)auVar45._12_4_;
                  auVar73 = vcvtdq2ps_avx(auVar103);
                  auVar45 = vcmpps_avx(auVar45,auVar73,1);
                  auVar45 = vandps_avx(auVar45,auVar64);
                  auVar45 = vsubps_avx(auVar73,auVar45);
                  auVar39._8_4_ = 0x3f318000;
                  auVar39._0_8_ = 0x3f3180003f318000;
                  auVar39._12_4_ = 0x3f318000;
                  auVar73 = vfmsub231ps_fma(auVar89,auVar45,auVar39);
                  auVar59._8_4_ = 0x395e8083;
                  auVar59._0_8_ = 0x395e8083395e8083;
                  auVar59._12_4_ = 0x395e8083;
                  auVar89 = vfmsub231ps_fma(auVar73,auVar45,auVar59);
                  auVar104._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                  auVar104._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                  auVar104._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                  auVar104._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                  auVar91._8_4_ = 0x39506967;
                  auVar91._0_8_ = 0x3950696739506967;
                  auVar91._12_4_ = 0x39506967;
                  auVar60._8_4_ = 0x3ab743ce;
                  auVar60._0_8_ = 0x3ab743ce3ab743ce;
                  auVar60._12_4_ = 0x3ab743ce;
                  auVar73 = vfmadd213ps_fma(auVar91,auVar89,auVar60);
                  auVar61._8_4_ = 0x3c088908;
                  auVar61._0_8_ = 0x3c0889083c088908;
                  auVar61._12_4_ = 0x3c088908;
                  auVar73 = vfmadd213ps_fma(auVar73,auVar89,auVar61);
                  auVar40._8_4_ = 0x3d2aa9c1;
                  auVar40._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar40._12_4_ = 0x3d2aa9c1;
                  auVar73 = vfmadd213ps_fma(auVar73,auVar89,auVar40);
                  auVar41._8_4_ = 0x3e2aaaaa;
                  auVar41._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar41._12_4_ = 0x3e2aaaaa;
                  auVar73 = vfmadd213ps_fma(auVar73,auVar89,auVar41);
                  auVar56 = vfmadd213ps_fma(auVar73,auVar89,auVar56);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar104,auVar89);
                  auVar49._0_4_ = auVar56._0_4_ + fVar7;
                  auVar49._4_4_ = auVar56._4_4_ + fVar8;
                  auVar49._8_4_ = auVar56._8_4_ + fVar9;
                  auVar49._12_4_ = auVar56._12_4_ + fVar10;
                  auVar92 = ZEXT864(0) << 0x20;
                  auVar75._0_4_ = (int)auVar45._0_4_;
                  auVar75._4_4_ = (int)auVar45._4_4_;
                  auVar75._8_4_ = (int)auVar45._8_4_;
                  auVar75._12_4_ = (int)auVar45._12_4_;
                  auVar56 = vpslld_avx(auVar75,0x17);
                  auVar56 = vpaddd_avx(auVar56,auVar64);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar49,auVar64);
                  auVar73 = vdivps_avx(auVar64,auVar56);
                  break;
                case 5:
                  auVar93._8_4_ = 0x42b0c0a5;
                  auVar93._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar93._12_4_ = 0x42b0c0a5;
                  auVar45 = vminps_avx(auVar73,auVar93);
                  auVar95._8_4_ = 0xc2b0c0a5;
                  auVar95._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar95._12_4_ = 0xc2b0c0a5;
                  auVar62 = vmaxps_avx(auVar95,auVar45);
                  auVar97._8_4_ = 0x3fb8aa3b;
                  auVar97._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar97._12_4_ = 0x3fb8aa3b;
                  auVar45 = vfmadd213ps_fma(auVar97,auVar62,auVar56);
                  auVar99._0_4_ = (int)auVar45._0_4_;
                  auVar99._4_4_ = (int)auVar45._4_4_;
                  auVar99._8_4_ = (int)auVar45._8_4_;
                  auVar99._12_4_ = (int)auVar45._12_4_;
                  auVar89 = vcvtdq2ps_avx(auVar99);
                  auVar45 = vcmpps_avx(auVar45,auVar89,1);
                  auVar45 = vandps_avx(auVar45,auVar64);
                  auVar45 = vsubps_avx(auVar89,auVar45);
                  auVar94._8_4_ = 0x3f318000;
                  auVar94._0_8_ = 0x3f3180003f318000;
                  auVar94._12_4_ = 0x3f318000;
                  auVar89 = vfmsub231ps_fma(auVar62,auVar45,auVar94);
                  auVar96._8_4_ = 0xb95e8083;
                  auVar96._0_8_ = 0xb95e8083b95e8083;
                  auVar96._12_4_ = 0xb95e8083;
                  auVar62 = vfnmsub231ps_fma(auVar89,auVar45,auVar96);
                  auVar100._0_4_ = auVar62._0_4_ * auVar62._0_4_;
                  auVar100._4_4_ = auVar62._4_4_ * auVar62._4_4_;
                  auVar100._8_4_ = auVar62._8_4_ * auVar62._8_4_;
                  auVar100._12_4_ = auVar62._12_4_ * auVar62._12_4_;
                  auVar98._8_4_ = 0x39506967;
                  auVar98._0_8_ = 0x3950696739506967;
                  auVar98._12_4_ = 0x39506967;
                  auVar63._8_4_ = 0x3ab743ce;
                  auVar63._0_8_ = 0x3ab743ce3ab743ce;
                  auVar63._12_4_ = 0x3ab743ce;
                  auVar89 = vfmadd213ps_fma(auVar98,auVar62,auVar63);
                  auVar89 = vfmadd213ps_fma(auVar89,auVar62,auVar72);
                  auVar69._8_4_ = 0x3d2aa9c1;
                  auVar69._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar69._12_4_ = 0x3d2aa9c1;
                  auVar89 = vfmadd213ps_fma(auVar89,auVar62,auVar69);
                  auVar70._8_4_ = 0x3e2aaaaa;
                  auVar70._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar70._12_4_ = 0x3e2aaaaa;
                  auVar89 = vfmadd213ps_fma(auVar89,auVar62,auVar70);
                  auVar89 = vfmadd213ps_fma(auVar89,auVar62,auVar56);
                  auVar89 = vfmadd213ps_fma(auVar89,auVar100,auVar62);
                  auVar50._0_4_ = auVar89._0_4_ + fVar7;
                  auVar50._4_4_ = auVar89._4_4_ + fVar8;
                  auVar50._8_4_ = auVar89._8_4_ + fVar9;
                  auVar50._12_4_ = auVar89._12_4_ + fVar10;
                  auVar44._0_4_ = (int)auVar45._0_4_;
                  auVar44._4_4_ = (int)auVar45._4_4_;
                  auVar44._8_4_ = (int)auVar45._8_4_;
                  auVar44._12_4_ = (int)auVar45._12_4_;
                  auVar45 = vpslld_avx(auVar44,0x17);
                  auVar45 = vpaddd_avx(auVar45,auVar64);
                  auVar38 = vfmadd213ps_fma(auVar45,auVar50,auVar64);
                  auVar34._8_4_ = 0x800000;
                  auVar34._0_8_ = 0x80000000800000;
                  auVar34._12_4_ = 0x800000;
                  auVar45 = vmaxps_avx(auVar38,auVar34);
                  auVar89 = vpsrld_avx(auVar45,0x17);
                  auVar35._8_4_ = 0xffffff82;
                  auVar35._0_8_ = 0xffffff82ffffff82;
                  auVar35._12_4_ = 0xffffff82;
                  auVar89 = vpaddd_avx(auVar89,auVar35);
                  auVar36._8_4_ = 0x807fffff;
                  auVar36._0_8_ = 0x807fffff807fffff;
                  auVar36._12_4_ = 0x807fffff;
                  auVar45 = vandps_avx(auVar45,auVar36);
                  auVar11 = vorps_avx(auVar45,auVar56);
                  auVar62 = vcvtdq2ps_avx(auVar89);
                  auVar37._8_4_ = 0x3f3504f3;
                  auVar37._0_8_ = 0x3f3504f33f3504f3;
                  auVar37._12_4_ = 0x3f3504f3;
                  auVar89 = vcmpps_avx(auVar11,auVar37,1);
                  auVar45 = vandps_avx(auVar89,auVar11);
                  auVar51._0_4_ = auVar11._0_4_ + -1.0 + auVar45._0_4_;
                  auVar51._4_4_ = auVar11._4_4_ + -1.0 + auVar45._4_4_;
                  auVar51._8_4_ = auVar11._8_4_ + -1.0 + auVar45._8_4_;
                  auVar51._12_4_ = auVar11._12_4_ + -1.0 + auVar45._12_4_;
                  auVar45 = vandps_avx(auVar89,auVar64);
                  auVar89 = vsubps_avx(auVar62,auVar45);
                  auVar90._0_4_ = auVar51._0_4_ * auVar51._0_4_;
                  auVar90._4_4_ = auVar51._4_4_ * auVar51._4_4_;
                  auVar90._8_4_ = auVar51._8_4_ * auVar51._8_4_;
                  auVar90._12_4_ = auVar51._12_4_ * auVar51._12_4_;
                  auVar101._8_4_ = 0x3d9021bb;
                  auVar101._0_8_ = 0x3d9021bb3d9021bb;
                  auVar101._12_4_ = 0x3d9021bb;
                  auVar80._8_4_ = 0xbdebd1b8;
                  auVar80._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar80._12_4_ = 0xbdebd1b8;
                  auVar45 = vfmadd213ps_fma(auVar101,auVar51,auVar80);
                  auVar81._8_4_ = 0x3def251a;
                  auVar81._0_8_ = 0x3def251a3def251a;
                  auVar81._12_4_ = 0x3def251a;
                  auVar45 = vfmadd213ps_fma(auVar45,auVar51,auVar81);
                  auVar82._8_4_ = 0xbdfe5d4f;
                  auVar82._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar82._12_4_ = 0xbdfe5d4f;
                  auVar45 = vfmadd213ps_fma(auVar45,auVar51,auVar82);
                  auVar83._8_4_ = 0x3e11e9bf;
                  auVar83._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar83._12_4_ = 0x3e11e9bf;
                  auVar45 = vfmadd213ps_fma(auVar45,auVar51,auVar83);
                  auVar84._8_4_ = 0xbe2aae50;
                  auVar84._0_8_ = 0xbe2aae50be2aae50;
                  auVar84._12_4_ = 0xbe2aae50;
                  auVar45 = vfmadd213ps_fma(auVar45,auVar51,auVar84);
                  auVar85._8_4_ = 0x3e4cceac;
                  auVar85._0_8_ = 0x3e4cceac3e4cceac;
                  auVar85._12_4_ = 0x3e4cceac;
                  auVar45 = vfmadd213ps_fma(auVar45,auVar51,auVar85);
                  auVar86._8_4_ = 0xbe7ffffc;
                  auVar86._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar86._12_4_ = 0xbe7ffffc;
                  auVar45 = vfmadd213ps_fma(auVar45,auVar51,auVar86);
                  auVar87._8_4_ = 0x3eaaaaaa;
                  auVar87._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar87._12_4_ = 0x3eaaaaaa;
                  auVar45 = vfmadd213ps_fma(auVar45,auVar51,auVar87);
                  auVar88._0_4_ = auVar90._0_4_ * auVar51._0_4_ * auVar45._0_4_;
                  auVar88._4_4_ = auVar90._4_4_ * auVar51._4_4_ * auVar45._4_4_;
                  auVar88._8_4_ = auVar90._8_4_ * auVar51._8_4_ * auVar45._8_4_;
                  auVar88._12_4_ = auVar90._12_4_ * auVar51._12_4_ * auVar45._12_4_;
                  auVar45 = vfmadd231ps_fma(auVar88,auVar89,auVar96);
                  auVar62 = vfmsub231ps_fma(auVar45,auVar56,auVar90);
                  auVar11._12_4_ = 0;
                  auVar11._0_12_ = ZEXT412(0);
                  auVar92 = ZEXT1264(ZEXT412(0)) << 0x20;
                  auVar45 = vcmpps_avx(auVar38,auVar11 << 0x20,2);
                  auVar62 = vsubps_avx(auVar62,auVar51);
                  auVar89 = vfnmadd231ps_fma(auVar62,auVar94,auVar89);
                  auVar52._0_4_ = auVar89._0_4_ + auVar89._0_4_;
                  auVar52._4_4_ = auVar89._4_4_ + auVar89._4_4_;
                  auVar52._8_4_ = auVar89._8_4_ + auVar89._8_4_;
                  auVar52._12_4_ = auVar89._12_4_ + auVar89._12_4_;
                  auVar65._8_4_ = 0x7fffffff;
                  auVar65._0_8_ = 0x7fffffff7fffffff;
                  auVar65._12_4_ = 0x7fffffff;
                  auVar45 = vblendvps_avx(auVar52,auVar65,auVar45);
                  auVar53._8_4_ = 0x42b0c0a5;
                  auVar53._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar53._12_4_ = 0x42b0c0a5;
                  auVar45 = vminps_avx(auVar45,auVar53);
                  auVar54._8_4_ = 0xc2b0c0a5;
                  auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar54._12_4_ = 0xc2b0c0a5;
                  auVar62 = vmaxps_avx(auVar45,auVar54);
                  auVar45 = vfmadd213ps_fma(auVar97,auVar62,auVar56);
                  auVar66._0_4_ = (int)auVar45._0_4_;
                  auVar66._4_4_ = (int)auVar45._4_4_;
                  auVar66._8_4_ = (int)auVar45._8_4_;
                  auVar66._12_4_ = (int)auVar45._12_4_;
                  auVar89 = vcvtdq2ps_avx(auVar66);
                  auVar45 = vcmpps_avx(auVar45,auVar89,1);
                  auVar45 = vandps_avx(auVar45,auVar64);
                  auVar45 = vsubps_avx(auVar89,auVar45);
                  auVar89 = vfmsub231ps_fma(auVar62,auVar45,auVar94);
                  auVar62 = vfnmsub231ps_fma(auVar89,auVar45,auVar96);
                  auVar67._0_4_ = auVar62._0_4_ * auVar62._0_4_;
                  auVar67._4_4_ = auVar62._4_4_ * auVar62._4_4_;
                  auVar67._8_4_ = auVar62._8_4_ * auVar62._8_4_;
                  auVar67._12_4_ = auVar62._12_4_ * auVar62._12_4_;
                  auVar89 = vfmadd213ps_fma(auVar98,auVar62,auVar63);
                  auVar43 = ZEXT1664(auVar56);
                  auVar89 = vfmadd213ps_fma(auVar89,auVar62,auVar72);
                  auVar71._8_4_ = 0x3d2aa9c1;
                  auVar71._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar71._12_4_ = 0x3d2aa9c1;
                  auVar89 = vfmadd213ps_fma(auVar89,auVar62,auVar71);
                  auVar89 = vfmadd213ps_fma(auVar89,auVar62,auVar70);
                  auVar56 = vfmadd213ps_fma(auVar89,auVar62,auVar56);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar67,auVar62);
                  auVar68 = ZEXT1664(auVar64);
                  auVar46._0_4_ = auVar56._0_4_ + fVar7;
                  auVar46._4_4_ = auVar56._4_4_ + fVar8;
                  auVar46._8_4_ = auVar56._8_4_ + fVar9;
                  auVar46._12_4_ = auVar56._12_4_ + fVar10;
                  auVar55._0_4_ = (int)auVar45._0_4_;
                  auVar55._4_4_ = (int)auVar45._4_4_;
                  auVar55._8_4_ = (int)auVar45._8_4_;
                  auVar55._12_4_ = (int)auVar45._12_4_;
                  auVar56 = vpslld_avx(auVar55,0x17);
                  auVar56 = vpaddd_avx(auVar56,auVar64);
                  auVar56 = vfmadd213ps_fma(auVar56,auVar46,auVar64);
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar56 = vdivps_avx(auVar38,auVar56);
                  auVar73 = vfmsub231ps_fma(auVar73,auVar73,auVar56);
                  break;
                case 6:
                  puVar5 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar5;
                  auVar89._4_4_ = uVar1;
                  auVar89._0_4_ = uVar1;
                  auVar89._8_4_ = uVar1;
                  auVar89._12_4_ = uVar1;
                  uVar1 = puVar5[1];
                  auVar62._4_4_ = uVar1;
                  auVar62._0_4_ = uVar1;
                  auVar62._8_4_ = uVar1;
                  auVar62._12_4_ = uVar1;
                  auVar56 = vfmadd231ps_fma(auVar62,auVar73,auVar89);
                  auVar56 = vmaxps_avx(auVar45,auVar56);
                  auVar56 = vminps_avx(auVar56,auVar64);
                  auVar73._0_4_ = auVar73._0_4_ * auVar56._0_4_;
                  auVar73._4_4_ = fVar77 * auVar56._4_4_;
                  auVar73._8_4_ = fVar78 * auVar56._8_4_;
                  auVar73._12_4_ = fVar79 * auVar56._12_4_;
                }
                *(undefined1 (*) [16])((long)pvVar32 + uVar30 * 0x10) = auVar73;
                uVar30 = uVar30 + 1;
              } while (uVar30 != _w);
            }
            pvVar32 = (void *)((long)pvVar32 + (long)(int)(_w * 4) * 4);
            bVar33 = iVar2 != iVar31;
            iVar2 = iVar2 + 1;
          } while (bVar33);
        }
        local_218 = local_218 + 1;
        iVar19 = iVar19 + uVar23 * 4;
      } while (local_218 != uVar20);
    }
LAB_003ecc3a:
    if (local_158.data != (void *)0x0) {
      operator_delete(local_158.data,local_158.elemsize - (long)local_158.data);
    }
  }
  iVar17 = 0;
LAB_003ec363:
  piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}